

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

IteratedExpr __thiscall ExprVisitorTest::MakeIterated(ExprVisitorTest *this,Kind kind)

{
  IteratedExprBuilder builder_00;
  IteratedExpr IVar1;
  long in_RDI;
  IteratedExprBuilder IVar2;
  IteratedExprBuilder builder;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *in_stack_ffffffffffffffa8;
  ExprBase in_stack_ffffffffffffffb0;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  *this_00;
  ExprBase in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uStack_1c;
  
  IVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginIterated
                    ((BasicExprFactory<std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (Kind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                    );
  this_00 = *(BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
              **)(in_RDI + 0x1cc0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            (in_stack_ffffffffffffffa8,(Reference)in_stack_ffffffffffffffb0.impl_,
             (type_conflict)((ulong)in_RDI >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  ::AddArg(this_00,(Arg)in_stack_ffffffffffffffc0.impl_);
  builder_00.impl_._4_4_ = uStack_1c;
  builder_00.impl_._0_4_ = IVar2.arg_index_;
  builder_00._8_8_ = this_00;
  IVar1 = mp::BasicExprFactory<std::allocator<char>_>::EndIterated
                    ((BasicExprFactory<std::allocator<char>_> *)IVar2.impl_,builder_00);
  return (BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>)
         IVar1.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_;
}

Assistant:

mp::IteratedExpr MakeIterated(expr::Kind kind) {
    auto builder = factory_.BeginIterated(kind, 1);
    builder.AddArg(var_);
    return factory_.EndIterated(builder);
  }